

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O3

void __thiscall
vector_bagwell<unsigned_char_*,_16U>::push_back
          (vector_bagwell<unsigned_char_*,_16U> *this,uchar **t)

{
  uchar *puVar1;
  uchar **ppuVar2;
  size_t sVar3;
  size_t local_20;
  
  sVar3 = this->_left_in_block;
  if (this->_left_in_block == 0) {
    vector_bagwell<unsigned_char*,16u>::push_back();
    sVar3 = local_20;
  }
  puVar1 = *t;
  ppuVar2 = this->_insertpos;
  this->_insertpos = ppuVar2 + 1;
  *ppuVar2 = puVar1;
  this->_left_in_block = sVar3 - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}